

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O2

double ddot(int n,double *dx,int incx,double *dy,int incy)

{
  undefined1 auVar1 [16];
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  bool bVar6;
  double dVar7;
  
  if (n < 1) {
    dVar7 = 0.0;
  }
  else {
    if (incy != 1 || incx != 1) {
      pdVar3 = dy + (incy >> 0x1f & (1 - n) * incy);
      pdVar4 = dx + (incx >> 0x1f & (1 - n) * incx);
      dVar7 = 0.0;
      while (bVar6 = n != 0, n = n + -1, bVar6) {
        dVar7 = dVar7 + *pdVar4 * *pdVar3;
        pdVar3 = pdVar3 + incy;
        pdVar4 = pdVar4 + incx;
      }
      return dVar7;
    }
    dVar7 = 0.0;
    for (uVar5 = 0; (ulong)(uint)n % 5 != uVar5; uVar5 = uVar5 + 1) {
      dVar7 = dVar7 + dx[uVar5] * dy[uVar5];
    }
    uVar5 = CONCAT44(0,n);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    lVar2 = SUB168(auVar1 / ZEXT816(5),0);
    for (; SUB164(auVar1 / ZEXT816(5),0) * -5 + (int)uVar5 < n; uVar5 = uVar5 + 5) {
      dVar7 = dx[lVar2 * -5 + uVar5 + 4] * dy[lVar2 * -5 + uVar5 + 4] +
              dx[lVar2 * -5 + uVar5 + 3] * dy[lVar2 * -5 + uVar5 + 3] +
              dx[lVar2 * -5 + uVar5 + 2] * dy[lVar2 * -5 + uVar5 + 2] +
              dx[lVar2 * -5 + uVar5 + 1] * dy[lVar2 * -5 + uVar5 + 1] +
              dx[lVar2 * -5 + uVar5] * dy[lVar2 * -5 + uVar5] + dVar7;
    }
  }
  return dVar7;
}

Assistant:

double ddot ( int n, double dx[], int incx, double dy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    DDOT forms the dot product of two vectors.
//
//  Discussion:
//
//    This routine uses unrolled loops for increments equal to one.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, double DX[*], the first vector.
//
//    Input, int INCX, the increment between successive entries in DX.
//
//    Input, double DY[*], the second vector.
//
//    Input, int INCY, the increment between successive entries in DY.
//
//    Output, double DDOT, the sum of the product of the corresponding
//    entries of DX and DY.
//
{
  double dtemp;
  int i;
  int ix;
  int iy;
  int m;

  dtemp = 0.0;

  if ( n <= 0 )
  {
    return dtemp;
  }
//
//  Code for unequal increments or equal increments
//  not equal to 1.
//
  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      dtemp = dtemp + dx[ix] * dy[iy];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
//
//  Code for both increments equal to 1.
//
  else
  {
    m = n % 5;

    for ( i = 0; i < m; i++ )
    {
      dtemp = dtemp + dx[i] * dy[i];
    }

    for ( i = m; i < n; i = i + 5 )
    {
      dtemp = dtemp + dx[i  ] * dy[i  ]
                    + dx[i+1] * dy[i+1]
                    + dx[i+2] * dy[i+2]
                    + dx[i+3] * dy[i+3]
                    + dx[i+4] * dy[i+4];
    }

  }

  return dtemp;
}